

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_v_predictor_8x16_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined8 uVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ushort uVar8;
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  ushort uVar9;
  ushort uVar14;
  ushort uVar16;
  ushort uVar18;
  ushort uVar20;
  ushort uVar22;
  ushort uVar24;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ushort uVar10;
  ushort uVar15;
  ushort uVar17;
  ushort uVar19;
  ushort uVar21;
  ushort uVar23;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  undefined1 auVar13 [16];
  int y_mask;
  __m128i top;
  __m128i round;
  __m128i scaled_bottom_left2;
  __m128i scaled_bottom_left1;
  __m128i inverted_weights2;
  __m128i inverted_weights1;
  __m128i scale;
  __m128i weights2;
  __m128i weights1;
  __m128i weights;
  __m128i bottom_left;
  __m128i pred_1;
  __m128i pred_sum_1;
  __m128i pred;
  __m128i pred_sum;
  __m128i weighted_px;
  __m128i weighted_px_1;
  undefined4 local_6bc;
  undefined4 local_67c;
  undefined8 local_5a8;
  undefined1 local_4e8;
  undefined1 uStack_4e7;
  undefined1 uStack_4e6;
  undefined1 uStack_4e5;
  undefined1 uStack_4e4;
  undefined1 uStack_4e3;
  undefined1 uStack_4e2;
  undefined1 uStack_4e1;
  undefined2 uStack_412;
  undefined2 uStack_40a;
  undefined2 uStack_3f6;
  undefined2 uStack_3f4;
  undefined2 uStack_3f2;
  undefined2 uStack_3ee;
  undefined2 uStack_3ec;
  undefined2 uStack_3ea;
  undefined2 local_f8;
  undefined2 uStack_f6;
  undefined2 uStack_f4;
  undefined2 uStack_f2;
  undefined2 uStack_f0;
  undefined2 uStack_ee;
  undefined2 uStack_ec;
  undefined2 uStack_ea;
  undefined2 local_e8;
  undefined2 uStack_e6;
  undefined2 uStack_e4;
  undefined2 uStack_e2;
  undefined2 uStack_e0;
  undefined2 uStack_de;
  undefined2 uStack_dc;
  undefined2 uStack_da;
  undefined2 uStack_d6;
  undefined2 uStack_d4;
  undefined2 uStack_d2;
  undefined2 uStack_ce;
  undefined2 uStack_cc;
  undefined2 uStack_ca;
  undefined2 uStack_78;
  undefined2 uStack_76;
  undefined2 uStack_74;
  undefined2 uStack_72;
  __m128i scaled_bottom_left_y_1;
  __m128i weights_y_1;
  __m128i y_select_1;
  int y_mask_1;
  __m128i scaled_bottom_left_y;
  __m128i weights_y;
  __m128i y_select;
  
  bVar2 = *(byte *)(in_RCX + 0xf);
  uVar8 = CONCAT11(0,bVar2);
  uStack_3f6 = (ushort)bVar2;
  uStack_3f4 = (ushort)bVar2;
  uStack_3f2 = (ushort)bVar2;
  uStack_3ee = (ushort)bVar2;
  uStack_3ec = (ushort)bVar2;
  uStack_3ea = (ushort)bVar2;
  uStack_412 = (ushort)bVar2;
  uStack_40a = (ushort)bVar2;
  uVar1 = *in_RDX;
  local_4e8 = (byte)uVar1;
  uStack_4e7 = (byte)((ulong)uVar1 >> 8);
  uStack_4e6 = (byte)((ulong)uVar1 >> 0x10);
  uStack_4e5 = (byte)((ulong)uVar1 >> 0x18);
  uStack_4e4 = (byte)((ulong)uVar1 >> 0x20);
  uStack_4e3 = (byte)((ulong)uVar1 >> 0x28);
  uStack_4e2 = (byte)((ulong)uVar1 >> 0x30);
  uStack_4e1 = (byte)((ulong)uVar1 >> 0x38);
  local_5a8 = in_RDI;
  for (local_67c = 0x1000100; local_67c < 0xf0e0f0f; local_67c = local_67c + 0x2020202) {
    auVar7._8_7_ = 0x540066007b0091;
    auVar7._0_8_ = 0xaa00c400e100ff;
    auVar7[0xf] = 0;
    auVar6._8_8_ = CONCAT44(local_67c,local_67c);
    auVar6._0_8_ = CONCAT44(local_67c,local_67c);
    auVar11 = pshufb(auVar7,auVar6);
    auVar5._2_2_ = uStack_3f6 * 0x1f;
    auVar5._0_2_ = uVar8;
    auVar5._4_2_ = uStack_3f4 * 0x3c;
    auVar5._6_2_ = uStack_3f2 * 0x56;
    auVar5._10_2_ = uStack_3ee * 0x85;
    auVar5._8_2_ = uVar8 * 0x6f;
    auVar5._12_2_ = uStack_3ec * 0x9a;
    auVar5._14_2_ = uStack_3ea * 0xac;
    auVar4._8_8_ = CONCAT44(local_67c,local_67c);
    auVar4._0_8_ = CONCAT44(local_67c,local_67c);
    auVar12 = pshufb(auVar5,auVar4);
    uStack_d6 = (ushort)uStack_4e7;
    uStack_d4 = (ushort)uStack_4e6;
    uStack_d2 = (ushort)uStack_4e5;
    uStack_ce = (ushort)uStack_4e3;
    uStack_cc = (ushort)uStack_4e2;
    uStack_ca = (ushort)uStack_4e1;
    local_e8 = auVar11._0_2_;
    uStack_e6 = auVar11._2_2_;
    uStack_e4 = auVar11._4_2_;
    uStack_e2 = auVar11._6_2_;
    uStack_e0 = auVar11._8_2_;
    uStack_de = auVar11._10_2_;
    uStack_dc = auVar11._12_2_;
    uStack_da = auVar11._14_2_;
    local_f8 = auVar12._0_2_;
    uStack_f6 = auVar12._2_2_;
    uStack_f4 = auVar12._4_2_;
    uStack_f2 = auVar12._6_2_;
    uStack_f0 = auVar12._8_2_;
    uStack_ee = auVar12._10_2_;
    uStack_ec = auVar12._12_2_;
    uStack_ea = auVar12._14_2_;
    uVar9 = local_f8 + (ushort)local_4e8 * local_e8 + 0x80;
    uVar14 = uStack_f6 + uStack_d6 * uStack_e6 + 0x80;
    uVar16 = uStack_f4 + uStack_d4 * uStack_e4 + 0x80;
    uVar18 = uStack_f2 + uStack_d2 * uStack_e2 + 0x80;
    uVar20 = uStack_f0 + (ushort)uStack_4e4 * uStack_e0 + 0x80;
    uVar22 = uStack_ee + uStack_ce * uStack_de + 0x80;
    uVar24 = uStack_ec + uStack_cc * uStack_dc + 0x80;
    uVar26 = uStack_ea + uStack_ca * uStack_da + 0x80;
    uVar10 = uVar9 >> 8;
    uVar15 = uVar14 >> 8;
    uVar17 = uVar16 >> 8;
    uVar19 = uVar18 >> 8;
    uVar21 = uVar20 >> 8;
    uVar23 = uVar22 >> 8;
    uVar25 = uVar24 >> 8;
    uVar27 = uVar26 >> 8;
    *local_5a8 = CONCAT17((uVar27 != 0) * (uVar27 < 0x100) * (char)(uVar26 >> 8) - (0xff < uVar27),
                          CONCAT16((uVar25 != 0) * (uVar25 < 0x100) * (char)(uVar24 >> 8) -
                                   (0xff < uVar25),
                                   CONCAT15((uVar23 != 0) * (uVar23 < 0x100) * (char)(uVar22 >> 8) -
                                            (0xff < uVar23),
                                            CONCAT14((uVar21 != 0) * (uVar21 < 0x100) *
                                                     (char)(uVar20 >> 8) - (0xff < uVar21),
                                                     CONCAT13((uVar19 != 0) * (uVar19 < 0x100) *
                                                              (char)(uVar18 >> 8) - (0xff < uVar19),
                                                              CONCAT12((uVar17 != 0) *
                                                                       (uVar17 < 0x100) *
                                                                       (char)(uVar16 >> 8) -
                                                                       (0xff < uVar17),
                                                                       CONCAT11((uVar15 != 0) *
                                                                                (uVar15 < 0x100) *
                                                                                (char)(uVar14 >> 8)
                                                                                - (0xff < uVar15),
                                                                                (uVar10 != 0) *
                                                                                (uVar10 < 0x100) *
                                                                                (char)(uVar9 >> 8) -
                                                                                (0xff < uVar10))))))
                                  ));
    local_5a8 = (undefined8 *)(in_RSI + (long)local_5a8);
  }
  for (local_6bc = 0x1000100; local_6bc < 0xf0e0f0f; local_6bc = local_6bc + 0x2020202) {
    auVar3._8_7_ = 0x1000110014001a;
    auVar3._0_8_ = 0x21002b00360044;
    auVar3[0xf] = 0;
    auVar13._8_8_ = CONCAT44(local_6bc,local_6bc);
    auVar13._0_8_ = CONCAT44(local_6bc,local_6bc);
    auVar13 = pshufb(auVar3,auVar13);
    auVar12._2_2_ = uStack_3f6 * 0xca;
    auVar12._0_2_ = uVar8 * 0xbc;
    auVar12._4_2_ = uStack_3f4 * 0xd5;
    auVar12._6_2_ = uStack_412 * 0xdf;
    auVar12._10_2_ = uStack_3ee * 0xec;
    auVar12._8_2_ = uVar8 * 0xe6;
    auVar12._12_2_ = uStack_3ec * 0xef;
    auVar12._14_2_ = uStack_40a * 0xf0;
    auVar11._8_8_ = CONCAT44(local_6bc,local_6bc);
    auVar11._0_8_ = CONCAT44(local_6bc,local_6bc);
    auVar11 = pshufb(auVar12,auVar11);
    weights_y_1[1]._3_1_ = 0;
    weights_y_1[1]._2_1_ = uStack_4e7;
    weights_y_1[1]._5_1_ = 0;
    weights_y_1[1]._4_1_ = uStack_4e6;
    weights_y_1[1]._7_1_ = 0;
    weights_y_1[1]._6_1_ = uStack_4e5;
    y_select_1[0]._3_1_ = 0;
    y_select_1[0]._2_1_ = uStack_4e3;
    y_select_1[0]._5_1_ = 0;
    y_select_1[0]._4_1_ = uStack_4e2;
    y_select_1[0]._7_1_ = 0;
    y_select_1[0]._6_1_ = uStack_4e1;
    scaled_bottom_left_y_1[1]._0_2_ = auVar13._0_2_;
    scaled_bottom_left_y_1[1]._2_2_ = auVar13._2_2_;
    scaled_bottom_left_y_1[1]._4_2_ = auVar13._4_2_;
    scaled_bottom_left_y_1[1]._6_2_ = auVar13._6_2_;
    weights_y_1[0]._0_2_ = auVar13._8_2_;
    weights_y_1[0]._2_2_ = auVar13._10_2_;
    weights_y_1[0]._4_2_ = auVar13._12_2_;
    weights_y_1[0]._6_2_ = auVar13._14_2_;
    uStack_78 = auVar11._0_2_;
    uStack_76 = auVar11._2_2_;
    uStack_74 = auVar11._4_2_;
    uStack_72 = auVar11._6_2_;
    scaled_bottom_left_y_1[0]._0_2_ = auVar11._8_2_;
    scaled_bottom_left_y_1[0]._2_2_ = auVar11._10_2_;
    scaled_bottom_left_y_1[0]._4_2_ = auVar11._12_2_;
    scaled_bottom_left_y_1[0]._6_2_ = auVar11._14_2_;
    uVar9 = uStack_78 + (ushort)local_4e8 * (short)scaled_bottom_left_y_1[1] + 0x80;
    uVar14 = uStack_76 + weights_y_1[1]._2_2_ * scaled_bottom_left_y_1[1]._2_2_ + 0x80;
    uVar16 = uStack_74 + weights_y_1[1]._4_2_ * scaled_bottom_left_y_1[1]._4_2_ + 0x80;
    uVar18 = uStack_72 + weights_y_1[1]._6_2_ * scaled_bottom_left_y_1[1]._6_2_ + 0x80;
    uVar20 = (short)scaled_bottom_left_y_1[0] + (ushort)uStack_4e4 * (short)weights_y_1[0] + 0x80;
    uVar22 = scaled_bottom_left_y_1[0]._2_2_ + y_select_1[0]._2_2_ * weights_y_1[0]._2_2_ + 0x80;
    uVar24 = scaled_bottom_left_y_1[0]._4_2_ + y_select_1[0]._4_2_ * weights_y_1[0]._4_2_ + 0x80;
    uVar26 = scaled_bottom_left_y_1[0]._6_2_ + y_select_1[0]._6_2_ * weights_y_1[0]._6_2_ + 0x80;
    uVar10 = uVar9 >> 8;
    uVar15 = uVar14 >> 8;
    uVar17 = uVar16 >> 8;
    uVar19 = uVar18 >> 8;
    uVar21 = uVar20 >> 8;
    uVar23 = uVar22 >> 8;
    uVar25 = uVar24 >> 8;
    uVar27 = uVar26 >> 8;
    *local_5a8 = CONCAT17((uVar27 != 0) * (uVar27 < 0x100) * (char)(uVar26 >> 8) - (0xff < uVar27),
                          CONCAT16((uVar25 != 0) * (uVar25 < 0x100) * (char)(uVar24 >> 8) -
                                   (0xff < uVar25),
                                   CONCAT15((uVar23 != 0) * (uVar23 < 0x100) * (char)(uVar22 >> 8) -
                                            (0xff < uVar23),
                                            CONCAT14((uVar21 != 0) * (uVar21 < 0x100) *
                                                     (char)(uVar20 >> 8) - (0xff < uVar21),
                                                     CONCAT13((uVar19 != 0) * (uVar19 < 0x100) *
                                                              (char)(uVar18 >> 8) - (0xff < uVar19),
                                                              CONCAT12((uVar17 != 0) *
                                                                       (uVar17 < 0x100) *
                                                                       (char)(uVar16 >> 8) -
                                                                       (0xff < uVar17),
                                                                       CONCAT11((uVar15 != 0) *
                                                                                (uVar15 < 0x100) *
                                                                                (char)(uVar14 >> 8)
                                                                                - (0xff < uVar15),
                                                                                (uVar10 != 0) *
                                                                                (uVar10 < 0x100) *
                                                                                (char)(uVar9 >> 8) -
                                                                                (0xff < uVar10))))))
                                  ));
    local_5a8 = (undefined8 *)(in_RSI + (long)local_5a8);
  }
  return;
}

Assistant:

void aom_smooth_v_predictor_8x16_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i bottom_left = _mm_set1_epi16(left_column[15]);
  const __m128i weights = LoadUnaligned16(smooth_weights + 12);

  const __m128i weights1 = cvtepu8_epi16(weights);
  const __m128i weights2 = cvtepu8_epi16(_mm_srli_si128(weights, 8));
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i scaled_bottom_left1 =
      _mm_mullo_epi16(inverted_weights1, bottom_left);
  const __m128i scaled_bottom_left2 =
      _mm_mullo_epi16(inverted_weights2, bottom_left);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  const __m128i top = cvtepu8_epi16(LoadLo8(top_row));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights1, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left1, y_select);
    write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                  &round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights2, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left2, y_select);
    write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                  &round);
    dst += stride;
  }
}